

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor *
ggml_flash_attn_ext(ggml_context *ctx,ggml_tensor *q,ggml_tensor *k,ggml_tensor *v,ggml_tensor *mask
                   ,float scale,float max_bias,float logit_softcap)

{
  undefined1 auVar1 [16];
  _Bool _Var2;
  ggml_tensor *pgVar3;
  char *pcVar4;
  int line;
  char *file;
  int64_t local_48;
  undefined1 local_40 [16];
  int64_t local_30;
  
  if (((k->ne[0] != q->ne[0]) || (q->ne[2] % k->ne[2] != 0)) || (q->ne[3] % k->ne[3] != 0)) {
    file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c";
    pcVar4 = "ggml_can_mul_mat(k, q)";
    line = 0x1135;
    goto LAB_0011e48f;
  }
  if (mask != (ggml_tensor *)0x0) {
    _Var2 = ggml_is_contiguous_n(mask,0);
    if (!_Var2) {
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c";
      pcVar4 = "ggml_is_contiguous(mask)";
      line = 0x1139;
      goto LAB_0011e48f;
    }
    if (mask->ne[2] != 1) {
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c";
      pcVar4 = "mask->ne[2] == 1";
      line = 0x113a;
      goto LAB_0011e48f;
    }
    if (mask->ne[3] != 1) {
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c";
      pcVar4 = "mask->ne[3] == 1";
      line = 0x113b;
      goto LAB_0011e48f;
    }
    if (mask->ne[1] < (long)(q->ne[1] + 0x3fU & 0xffffffffffffffc0)) {
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c";
      pcVar4 = 
      "mask->ne[1] >= GGML_PAD(q->ne[1], GGML_KQ_MASK_PAD) && \"the Flash-Attention kernel requires the mask to be padded to GGML_KQ_MASK_PAD and at least n_queries big\""
      ;
      line = 0x113d;
      goto LAB_0011e48f;
    }
  }
  if ((mask != (ggml_tensor *)0x0) || (max_bias <= 0.0)) {
    local_48 = v->ne[0];
    auVar1 = *(undefined1 (*) [16])(q->ne + 1);
    local_40._0_8_ = auVar1._8_8_;
    local_40._8_4_ = auVar1._0_4_;
    local_40._12_4_ = auVar1._4_4_;
    local_30 = q->ne[3];
    pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,&local_48,(ggml_tensor *)0x0,0);
    if (pgVar3 != (ggml_tensor *)0x0) {
      pgVar3->op_params[0] = (int32_t)scale;
      pgVar3->op_params[1] = (int32_t)max_bias;
      pgVar3->op_params[2] = (int32_t)logit_softcap;
      pgVar3->op = GGML_OP_FLASH_ATTN_EXT;
      pgVar3->src[0] = q;
      pgVar3->src[1] = k;
      pgVar3->src[2] = v;
      pgVar3->src[3] = mask;
      return pgVar3;
    }
    file = 
    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-impl.h";
    pcVar4 = "tensor != NULL";
    line = 0x70;
  }
  else {
    file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c";
    pcVar4 = "mask";
    line = 0x1142;
  }
LAB_0011e48f:
  ggml_abort(file,line,"GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

struct ggml_tensor * ggml_flash_attn_ext(
        struct ggml_context * ctx,
        struct ggml_tensor  * q,
        struct ggml_tensor  * k,
        struct ggml_tensor  * v,
        struct ggml_tensor  * mask,
        float                 scale,
        float                 max_bias,
        float                 logit_softcap) {
    GGML_ASSERT(ggml_can_mul_mat(k, q));
    // TODO: check if vT can be multiplied by (k*qT)

    if (mask) {
        GGML_ASSERT(ggml_is_contiguous(mask));
        GGML_ASSERT(mask->ne[2] == 1);
        GGML_ASSERT(mask->ne[3] == 1);
        GGML_ASSERT(mask->ne[1] >= GGML_PAD(q->ne[1], GGML_KQ_MASK_PAD) &&
                "the Flash-Attention kernel requires the mask to be padded to GGML_KQ_MASK_PAD and at least n_queries big");
        //GGML_ASSERT(ggml_can_repeat_rows(mask, qk));
    }

    if (max_bias > 0.0f) {
        GGML_ASSERT(mask);
    }

    // permute(0, 2, 1, 3)
    int64_t ne[4] = { v->ne[0], q->ne[2], q->ne[1], q->ne[3] };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    float params[] = { scale, max_bias, logit_softcap };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_FLASH_ATTN_EXT;
    result->src[0] = q;
    result->src[1] = k;
    result->src[2] = v;
    result->src[3] = mask;

    return result;
}